

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_folding.cpp
# Opt level: O3

void skiwi::anon_unknown_26::fold_fx_is_zero(PrimitiveCall *p,Expression *e)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Expression *e_00;
  bool bVar2;
  Fixnum f1;
  Literal lit1;
  Literal lit2;
  Fixnum local_178;
  False local_130;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_f0;
  undefined1 local_90;
  _Variadic_union<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
  local_88;
  undefined1 local_28;
  
  e_00 = (p->arguments).
         super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  if ((long)(p->arguments).
            super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
            ._M_impl.super__Vector_impl_data._M_finish - (long)e_00 == 0xf0) {
    local_f0._32_8_ = local_f0._M_first._M_storage._M_storage + 0x30;
    local_f0._0_8_ = 0xffffffffffffffff;
    local_f0._M_first._M_storage._M_storage[9] = '\0';
    local_f0._16_8_ = 0;
    local_f0._24_8_ = 0;
    local_f0._40_8_ = 0;
    local_f0._M_first._M_storage._M_storage[0x30] = '\0';
    local_90 = 0;
    local_88._32_8_ = local_88._M_first._M_storage._M_storage + 0x30;
    local_88._0_8_ = 0xffffffffffffffff;
    local_88._M_first._M_storage._M_storage[9] = '\0';
    local_88._16_8_ = 0;
    local_88._24_8_ = 0;
    local_88._40_8_ = 0;
    local_88._M_first._M_storage._M_storage[0x30] = '\0';
    local_28 = 0;
    paVar1 = &local_178.filename.field_2;
    local_178.line_nr = -1;
    local_178.column_nr = -1;
    local_178.tail_position = false;
    local_178.pre_scan_index = 0;
    local_178.scan_index = 0;
    local_178.filename._M_string_length = 0;
    local_178.filename.field_2._M_local_buf[0] = '\0';
    local_178.filename._M_dataplus._M_p = (pointer)paVar1;
    bVar2 = is_literal((Literal *)&local_f0._M_first,e_00);
    if (bVar2) {
      bVar2 = is_fixnum(&local_178,(Literal *)&local_f0._M_first);
      if (bVar2) {
        if (local_178.value == 0) {
          local_130.filename._M_dataplus._M_p = (pointer)&local_130.filename.field_2;
          local_130.line_nr = -1;
          local_130.column_nr = -1;
          local_130.tail_position = false;
          local_130.pre_scan_index = 0;
          local_130.scan_index = 0;
          local_130.filename._M_string_length = 0;
          local_130.filename.field_2._M_local_buf[0] = '\0';
          std::
          variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
          ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                       *)e,(True *)&local_130);
        }
        else {
          local_130.filename._M_dataplus._M_p = (pointer)&local_130.filename.field_2;
          local_130.line_nr = -1;
          local_130.column_nr = -1;
          local_130.tail_position = false;
          local_130.pre_scan_index = 0;
          local_130.scan_index = 0;
          local_130.filename._M_string_length = 0;
          local_130.filename.field_2._M_local_buf[0] = '\0';
          std::
          variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
          ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                       *)e,&local_130);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130.filename._M_dataplus._M_p != &local_130.filename.field_2) {
          operator_delete(local_130.filename._M_dataplus._M_p,
                          CONCAT71(local_130.filename.field_2._M_allocated_capacity._1_7_,
                                   local_130.filename.field_2._M_local_buf[0]) + 1);
        }
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178.filename._M_dataplus._M_p != paVar1) {
      operator_delete(local_178.filename._M_dataplus._M_p,
                      CONCAT71(local_178.filename.field_2._M_allocated_capacity._1_7_,
                               local_178.filename.field_2._M_local_buf[0]) + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_88._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
    ::~_Variant_storage((_Variant_storage<false,_skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>
                         *)&local_f0._M_first);
    return;
  }
  __assert_fail("p.arguments.size() == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/constant_folding.cpp"
                ,0x175,
                "void skiwi::(anonymous namespace)::fold_fx_is_zero(PrimitiveCall &, Expression &)")
  ;
}

Assistant:

void fold_fx_is_zero(PrimitiveCall& p, Expression& e)
    {
    assert(p.arguments.size() == 1);
    Literal lit1, lit2;
    Fixnum f1;
    if (is_literal(lit1, p.arguments[0]))
      {
      if (is_fixnum(f1, lit1))
        {
        if (f1.value == 0)
          e = make_true();
        else
          e = make_false();
        }
      }
    }